

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPluginLib.h
# Opt level: O2

ExtensionPtr __thiscall
plugin::StdPluginLib::GetExtension(StdPluginLib *this,InterfaceId *interface)

{
  __shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ExtensionPtr EVar6;
  string local_50 [32];
  
  p_Var5 = (__shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2> *)
           (interface->m_name)._M_string_length;
  p_Var1 = (__shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2> *)
           (interface->m_name).field_2._M_allocated_capacity;
  _Var4._M_pi = in_RDX;
  do {
    if (p_Var5 == p_Var1) {
      (this->super_IPluginLib)._vptr_IPluginLib = (_func_int **)0x0;
      (this->m_extensions).
      super__Vector_base<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00104a4c:
      EVar6.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      EVar6.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (ExtensionPtr)
             EVar6.
             super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>;
    }
    peVar2 = p_Var5->_M_ptr;
    std::__cxx11::string::string(local_50,(string *)in_RDX);
    iVar3 = (*peVar2->_vptr_IPluginInterface[3])(peVar2,local_50);
    std::__cxx11::string::~string(local_50);
    if ((char)iVar3 != '\0') {
      std::__shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2> *
                   )this,p_Var5);
      _Var4._M_pi = extraout_RDX_00;
      goto LAB_00104a4c;
    }
    p_Var5 = p_Var5 + 1;
    _Var4._M_pi = extraout_RDX;
  } while( true );
}

Assistant:

ExtensionPtr const GetExtension(const plugin::InterfaceId& interface) const override
        {
            for(auto const& extension : m_extensions)
            {
                if(extension->RttiMatch(interface))
                {
                    return extension;
                }
            }

            return nullptr;
        }